

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tensor.hpp
# Opt level: O0

void scp::_scp::bitReversal<std::complex<double>>
               (complex<double> *beg,uint64_t stride,uint64_t size,uint8_t bitCount)

{
  uint64_t uVar1;
  uint64_t r;
  uint64_t i;
  complex<double> *it;
  uint8_t bitCount_local;
  uint64_t size_local;
  uint64_t stride_local;
  complex<double> *beg_local;
  
  i = (uint64_t)(beg + stride);
  for (r = 1; r < size; r = r + 1) {
    uVar1 = reverse(r,bitCount);
    if (r < uVar1) {
      std::swap<std::complex<double>>((complex<double> *)i,beg + uVar1 * stride);
    }
    i = stride * 0x10 + i;
  }
  return;
}

Assistant:

constexpr void bitReversal(TValue* beg, uint64_t stride, uint64_t size, uint8_t bitCount)
		{
			TValue* it = beg + stride;
			for (uint64_t i = 1; i < size; ++i, it += stride)
			{
				uint64_t r = reverse(i, bitCount);
				if (r > i)
				{
					std::swap(*it, *(beg + r * stride));
				}
			}
		}